

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O0

int archive_compressor_gzip_options(archive_write_filter *f,char *key,char *value)

{
  int *piVar1;
  int iVar2;
  private_data_conflict5 *data;
  char *value_local;
  char *key_local;
  archive_write_filter *f_local;
  
  piVar1 = (int *)f->data;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    if ((((value == (char *)0x0) || (*value < '0')) || ('9' < *value)) || (value[1] != '\0')) {
      f_local._4_4_ = -0x14;
    }
    else {
      *piVar1 = *value + -0x30;
      f_local._4_4_ = 0;
    }
  }
  else {
    iVar2 = strcmp(key,"timestamp");
    if (iVar2 == 0) {
      iVar2 = 1;
      if (value == (char *)0x0) {
        iVar2 = -1;
      }
      piVar1[1] = iVar2;
      f_local._4_4_ = 0;
    }
    else {
      f_local._4_4_ = -0x14;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_gzip_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "timestamp") == 0) {
		data->timestamp = (value == NULL)?-1:1;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}